

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::configureFromArgs(CoreBroker *this,int argc,char **argv)

{
  string_view message;
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  BrokerBase *in_RDI;
  char **in_stack_00000020;
  int result;
  BrokerState in_stack_ffffffffffffffbc;
  BrokerState in_stack_ffffffffffffffbe;
  BrokerBase *in_stack_ffffffffffffffc0;
  BrokerState newState;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8 [12];
  
  bVar1 = BrokerBase::transitionBrokerState
                    (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,in_stack_ffffffffffffffbc);
  newState = (BrokerState)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
  if (bVar1) {
    iVar2 = BrokerBase::parseArgs((BrokerBase *)argv,result,in_stack_00000020);
    if (iVar2 == 0) {
      (**(code **)(*(long *)&in_RDI->global_id + 0x10))(&in_RDI->global_id);
    }
    else {
      BrokerBase::setBrokerState(in_RDI,newState);
      if (iVar2 < 0) {
        uVar3 = __cxa_allocate_exception(0x28);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffffd0,(char *)in_RDI);
        message._M_str._4_4_ = iVar2;
        message._0_12_ = in_stack_ffffffffffffffd8;
        InvalidParameter::InvalidParameter((InvalidParameter *)in_stack_ffffffffffffffd0,message);
        __cxa_throw(uVar3,&InvalidParameter::typeinfo,InvalidParameter::~InvalidParameter);
      }
    }
  }
  return;
}

Assistant:

void CoreBroker::configureFromArgs(int argc, char* argv[])
{
    if (transitionBrokerState(BrokerState::CREATED, BrokerState::CONFIGURING)) {
        auto result = parseArgs(argc, argv);
        if (result != 0) {
            setBrokerState(BrokerState::CREATED);
            if (result < 0) {
                throw(helics::InvalidParameter("invalid arguments in command line"));
            }
            return;
        }
        configureBase();
    }
}